

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O3

void __thiscall soul::SourceCodeOperations::SourceCodeOperations(SourceCodeOperations *this)

{
  (this->source).sourceCode.object = (SourceCodeText *)0x0;
  (this->source).location.data = (char *)0x0;
  PoolAllocator::PoolAllocator(&(this->allocator).pool);
  (this->allocator).identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocator).identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocator).identifiers.strings.
  super__Vector_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocator).stringDictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_002f5170;
  (this->allocator).stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->allocator).stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocator).stringDictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocator).stringDictionary.nextIndex = 1;
  memset(&this->topLevelNamespace,0,0x88);
  return;
}

Assistant:

SourceCodeOperations::SourceCodeOperations() = default;